

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
HeapDisposer<kj::_::AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,_kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>_>_>
::disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,_kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>_>_>
              *this,void *pointer)

{
  void *pvVar1;
  
  if (pointer != (void *)0x0) {
    pvVar1 = *(void **)((long)pointer + 0x1a0);
    if (*(long *)((long)pvVar1 + 0x10) == 0) {
      operator_delete(pvVar1,0x18);
    }
    else {
      *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    }
    ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>::~ExceptionOr
              ((ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo> *)
               ((long)pointer + 0x18));
  }
  operator_delete(pointer,0x1a8);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }